

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O0

CaseTreeNode * tcu::parseCaseList(istream *in)

{
  int iVar1;
  int_type iVar2;
  CaseTreeNode *this;
  invalid_argument *this_00;
  int curChr;
  allocator<char> local_39;
  string local_38;
  CaseTreeNode *local_18;
  CaseTreeNode *root;
  istream *in_local;
  
  root = (CaseTreeNode *)in;
  this = (CaseTreeNode *)operator_new(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  CaseTreeNode::CaseTreeNode(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_18 = this;
  iVar1 = std::istream::peek();
  if (iVar1 == 0x7b) {
    parseCaseTrie(local_18,(istream *)root);
  }
  else {
    parseCaseList(local_18,(istream *)root);
  }
  iVar1 = std::istream::get();
  iVar2 = std::char_traits<char>::eof();
  if ((iVar1 != iVar2) && (iVar1 != 0)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Trailing characters at end of case list");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return local_18;
}

Assistant:

static CaseTreeNode* parseCaseList (std::istream& in)
{
	CaseTreeNode* const root = new CaseTreeNode("");
	try
	{
		if (in.peek() == '{')
			parseCaseTrie(root, in);
		else
			parseCaseList(root, in);

		{
			const int curChr = in.get();
			if (curChr != std::char_traits<char>::eof() && curChr != 0)
				throw std::invalid_argument("Trailing characters at end of case list");
		}

		return root;
	}
	catch (...)
	{
		delete root;
		throw;
	}
}